

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O3

void stbi_decode_DXT1_block(uchar *uncompressed,uchar *compressed)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  
  uVar1 = *(ushort *)(compressed + 2);
  iVar2 = (uint)(compressed[1] >> 3) * 0xff;
  uVar3 = (iVar2 + 0x10U >> 5) + iVar2 + 0x10 >> 5;
  iVar2 = (*(ushort *)compressed >> 5 & 0x3f) * 0xff;
  uVar5 = (iVar2 + 0x20U >> 6) + iVar2 + 0x20 >> 6;
  iVar2 = (*compressed & 0x1f) * 0xff;
  uVar8 = iVar2 + (iVar2 + 0x10U >> 5) + 0x10 >> 5;
  local_38 = (char)uVar3;
  local_37 = (char)uVar5;
  local_36 = (char)uVar8;
  local_29 = 0xff;
  local_35 = 0xff;
  iVar2 = (uint)(compressed[3] >> 3) * 0xff;
  uVar7 = (iVar2 + 0x10U >> 5) + iVar2 + 0x10 >> 5;
  iVar2 = (uVar1 >> 5 & 0x3f) * 0xff;
  uVar10 = iVar2 + (iVar2 + 0x20U >> 6) + 0x20 >> 6;
  iVar2 = ((byte)*(ushort *)(compressed + 2) & 0x1f) * 0xff;
  uVar9 = (iVar2 + 0x10U >> 5) + iVar2 + 0x10 >> 5;
  local_34 = (char)uVar7;
  local_33 = (char)uVar10;
  local_32 = (char)uVar9;
  local_31 = 0xff;
  if (uVar1 < *(ushort *)compressed) {
    local_30 = (char)((uVar7 + uVar3 * 2) / 3);
    local_2f = (char)((uVar10 + uVar5 * 2) / 3);
    local_2e = (undefined1)((uVar9 + uVar8 * 2) / 3);
    local_2c = (undefined1)((uVar3 + uVar7 * 2) / 3);
    local_2b = (undefined1)((uVar5 + uVar10 * 2) / 3);
    local_2a = (undefined1)((uVar8 + uVar9 * 2) / 3);
  }
  else {
    local_30 = (char)(uVar7 + uVar3 >> 1);
    local_2f = (char)(uVar10 + uVar5 >> 1);
    local_2e = (undefined1)(uVar9 + uVar8 >> 1);
    local_2c = 0;
    local_2b = 0;
    local_2a = 0;
    local_29 = 0;
  }
  local_2d = 0xff;
  uVar3 = 0x20;
  uVar6 = 0xfffffffffffffffc;
  do {
    uVar5 = uVar3 >> 3;
    bVar4 = (byte)uVar3;
    uVar3 = uVar3 + 2;
    *(undefined4 *)(uncompressed + uVar6 + 4) =
         *(undefined4 *)(&local_38 + (ulong)(compressed[uVar5] >> (bVar4 & 6) & 3) * 4);
    uVar6 = uVar6 + 4;
  } while (uVar6 < 0x3c);
  return;
}

Assistant:

void stbi_decode_DXT1_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int next_bit = 4*8;
	int i, r, g, b;
	int c0, c1;
	unsigned char decode_colors[4*4];
	//	find the 2 primary colors
	c0 = compressed[0] + (compressed[1] << 8);
	c1 = compressed[2] + (compressed[3] << 8);
	stbi_rgb_888_from_565( c0, &r, &g, &b );
	decode_colors[0] = r;
	decode_colors[1] = g;
	decode_colors[2] = b;
	decode_colors[3] = 255;
	stbi_rgb_888_from_565( c1, &r, &g, &b );
	decode_colors[4] = r;
	decode_colors[5] = g;
	decode_colors[6] = b;
	decode_colors[7] = 255;
	if( c0 > c1 )
	{
		//	no alpha, 2 interpolated colors
		decode_colors[8] = (2*decode_colors[0] + decode_colors[4]) / 3;
		decode_colors[9] = (2*decode_colors[1] + decode_colors[5]) / 3;
		decode_colors[10] = (2*decode_colors[2] + decode_colors[6]) / 3;
		decode_colors[11] = 255;
		decode_colors[12] = (decode_colors[0] + 2*decode_colors[4]) / 3;
		decode_colors[13] = (decode_colors[1] + 2*decode_colors[5]) / 3;
		decode_colors[14] = (decode_colors[2] + 2*decode_colors[6]) / 3;
		decode_colors[15] = 255;
	} else
	{
		//	1 interpolated color, alpha
		decode_colors[8] = (decode_colors[0] + decode_colors[4]) / 2;
		decode_colors[9] = (decode_colors[1] + decode_colors[5]) / 2;
		decode_colors[10] = (decode_colors[2] + decode_colors[6]) / 2;
		decode_colors[11] = 255;
		decode_colors[12] = 0;
		decode_colors[13] = 0;
		decode_colors[14] = 0;
		decode_colors[15] = 0;
	}
	//	decode the block
	for( i = 0; i < 16*4; i += 4 )
	{
		int idx = ((compressed[next_bit>>3] >> (next_bit & 7)) & 3) * 4;
		next_bit += 2;
		uncompressed[i+0] = decode_colors[idx+0];
		uncompressed[i+1] = decode_colors[idx+1];
		uncompressed[i+2] = decode_colors[idx+2];
		uncompressed[i+3] = decode_colors[idx+3];
	}
	//	done
}